

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

size_t __thiscall
ktxValidator::validationContext::calcLevelOffset(validationContext *this,uint32_t level)

{
  validationContext *this_00;
  size_t sVar1;
  uint in_ESI;
  validationContext *in_RDI;
  size_t levelSize;
  uint32_t i;
  size_t levelOffset;
  uint32_t in_stack_ffffffffffffffcc;
  validationContext *in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffe4;
  uint32_t n;
  size_t local_18;
  
  if ((in_RDI->header).vkFormat == 0) {
    __assert_fail("header.vkFormat != VK_FORMAT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2cd,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  if ((in_RDI->header).supercompressionScheme == 0) {
    if (in_ESI < in_RDI->levelCount) {
      kvDataEndOffset(in_RDI);
      lcm4(in_stack_ffffffffffffffd8,(uint32_t)((ulong)in_RDI >> 0x20));
      local_18 = padn(in_stack_ffffffffffffffe4,(size_t)in_stack_ffffffffffffffd8);
      n = in_RDI->levelCount;
      while (n = n - 1, in_ESI < n) {
        this_00 = (validationContext *)calcLevelSize(in_RDI,in_stack_ffffffffffffffcc);
        lcm4(this_00,(uint32_t)((ulong)in_RDI >> 0x20));
        sVar1 = padn(n,(size_t)this_00);
        local_18 = sVar1 + local_18;
      }
      return local_18;
    }
    __assert_fail("level < levelCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                  ,0x2d0,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
  }
  __assert_fail("header.supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx2check/ktx2check.cpp"
                ,0x2ce,"size_t ktxValidator::validationContext::calcLevelOffset(uint32_t)");
}

Assistant:

size_t calcLevelOffset(uint32_t level) {
            // This function is only useful when the following 2 conditions
            // are met as otherwise we have no idea what the size of a level
            // ought to be.
            assert (header.vkFormat != VK_FORMAT_UNDEFINED);
            assert (header.supercompressionScheme == KTX_SS_NONE);

            assert (level < levelCount);
            // Calculate the expected base offset in the file
            size_t levelOffset = kvDataEndOffset();
            levelOffset
                  = padn(lcm4(formatInfo.blockByteLength), levelOffset);
            for (uint32_t i = levelCount - 1; i > level; i--) {
                size_t levelSize;
                levelSize = calcLevelSize(i);
                levelOffset
                    += padn(lcm4(formatInfo.blockByteLength), levelSize);
            }
            return levelOffset;
        }